

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::RunDelete(QL_Manager *this,QL_Node *topNode)

{
  Attr *attributes_00;
  int local_fc;
  char *pcStack_f8;
  int i;
  char *pData;
  RID rid;
  RM_Record rec;
  Attr *attributes;
  RM_FileHandle relFH;
  undefined1 local_68 [8];
  Printer printer;
  DataAttrInfo *printAttributes;
  int *attrList;
  int local_28;
  int attrListSize;
  int finalTupLength;
  RC rc;
  QL_Node *topNode_local;
  QL_Manager *this_local;
  
  attrListSize = 0;
  _finalTupLength = topNode;
  topNode_local = (QL_Node *)this;
  QL_Node::GetTupleLength(topNode,&local_28);
  attrListSize = QL_Node::GetAttrList
                           (_finalTupLength,(int **)&printAttributes,(int *)((long)&attrList + 4));
  this_local._4_4_ = attrListSize;
  if (attrListSize == 0) {
    printer._32_8_ = malloc((long)attrList._4_4_ * 0x44);
    attrListSize = SetUpPrinter(this,_finalTupLength,(DataAttrInfo *)printer._32_8_);
    this_local._4_4_ = attrListSize;
    if (attrListSize == 0) {
      Printer::Printer((Printer *)local_68,(DataAttrInfo *)printer._32_8_,attrList._4_4_);
      Printer::PrintHeader((Printer *)local_68,(ostream *)&std::cout);
      RM_FileHandle::RM_FileHandle((RM_FileHandle *)&attributes);
      attributes_00 = (Attr *)malloc((long)this->relEntries->attrCount * 0x30);
      attrListSize = SetUpRun(this,attributes_00,(RM_FileHandle *)&attributes);
      if (attrListSize == 0) {
        attrListSize = (**_finalTupLength->_vptr_QL_Node)();
        this_local._4_4_ = attrListSize;
        if (attrListSize == 0) {
          RM_Record::RM_Record((RM_Record *)&rid);
          RID::RID((RID *)&pData);
          while (attrListSize = (*_finalTupLength->_vptr_QL_Node[2])(_finalTupLength,&rid),
                attrListSize == 0) {
            attrListSize = RM_Record::GetRid((RM_Record *)&rid,(RID *)&pData);
            if ((attrListSize != 0) ||
               (attrListSize = RM_Record::GetData((RM_Record *)&rid,&stack0xffffffffffffff08),
               attrListSize != 0)) {
              this_local._4_4_ = attrListSize;
              goto LAB_0011b83a;
            }
            Printer::Print((Printer *)local_68,(ostream *)&std::cout,pcStack_f8);
            attrListSize = RM_FileHandle::DeleteRec((RM_FileHandle *)&attributes,(RID *)&pData);
            this_local._4_4_ = attrListSize;
            if (attrListSize != 0) goto LAB_0011b83a;
            for (local_fc = 0; attrListSize = 0, local_fc < this->relEntries->attrCount;
                local_fc = local_fc + 1) {
              if ((attributes_00[local_fc].indexNo != -1) &&
                 (attrListSize = IX_IndexHandle::DeleteEntry
                                           (&attributes_00[local_fc].ih,
                                            pcStack_f8 + attributes_00[local_fc].offset,
                                            (RID *)&pData), this_local._4_4_ = attrListSize,
                 attrListSize != 0)) goto LAB_0011b83a;
            }
          }
          this_local._4_4_ = attrListSize;
          if (((attrListSize == 0x199) &&
              (attrListSize = (*_finalTupLength->_vptr_QL_Node[3])(),
              this_local._4_4_ = attrListSize, attrListSize == 0)) &&
             (attrListSize = CleanUpRun(this,attributes_00,(RM_FileHandle *)&attributes),
             this_local._4_4_ = attrListSize, attrListSize == 0)) {
            Printer::PrintFooter((Printer *)local_68,(ostream *)&std::cout);
            free((void *)printer._32_8_);
            this_local._4_4_ = 0;
          }
LAB_0011b83a:
          RID::~RID((RID *)&pData);
          RM_Record::~RM_Record((RM_Record *)&rid);
        }
      }
      else {
        SM_Manager::CleanUpAttr(this->smm,attributes_00,this->relEntries->attrCount);
        this_local._4_4_ = attrListSize;
      }
      RM_FileHandle::~RM_FileHandle((RM_FileHandle *)&attributes);
      Printer::~Printer((Printer *)local_68);
    }
  }
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::RunDelete(QL_Node *topNode){
  RC rc = 0;
  // Retrieves the list of attributes associated with this relation, and set up the
  // printer
  int finalTupLength, attrListSize;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  DataAttrInfo * printAttributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, printAttributes)))
    return (rc);
  Printer printer(printAttributes, attrListSize);
  printer.PrintHeader(cout);

  // Open the appropriate file, and Attr* list for holding IX_IndexHandles
  // for efficient index updates
  RM_FileHandle relFH;
  Attr* attributes = (Attr *)malloc(sizeof(Attr)*relEntries->attrCount);
  if((rc = SetUpRun(attributes, relFH))){
    smm.CleanUpAttr(attributes, relEntries->attrCount);
    return (rc);
  } 
  
  // Retrieves records
  if((rc = topNode->OpenIt() ))
    return (rc);

  RM_Record rec;
  RID rid;
  while(true){
    if((rc = topNode->GetNextRec(rec))){
      if (rc == QL_EOI){
        break;
      }
      return (rc);
    }
    char *pData;
    if((rc = rec.GetRid(rid)) || (rc = rec.GetData(pData)) )
      return (rc);
    printer.Print(cout, pData); // print out info about the attribute to delete
    if((rc = relFH.DeleteRec(rid))) // delete it
      return (rc);
    
    // Delete it from any index as well
    for(int i=0; i < relEntries->attrCount ; i++){
      if(attributes[i].indexNo != -1){
        if((rc = attributes[i].ih.DeleteEntry((void *)(pData + attributes[i].offset), rid)))
          return (rc);
      }
    }
  }
  
  if((rc = topNode->CloseIt()))
    return (rc);


  if((rc = CleanUpRun(attributes, relFH)))
    return (rc);

  printer.PrintFooter(cout);
  free(printAttributes);

  return (0);
}